

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::SimpleAssignmentPatternSyntax::SimpleAssignmentPatternSyntax
          (SimpleAssignmentPatternSyntax *this,Token openBrace,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *items,Token closeBrace)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  long lVar8;
  
  uVar6 = closeBrace._0_8_;
  uVar5 = openBrace._0_8_;
  (this->super_AssignmentPatternSyntax).super_SyntaxNode.kind = SimpleAssignmentPattern;
  (this->super_AssignmentPatternSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_AssignmentPatternSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (this->openBrace).kind = (short)uVar5;
  (this->openBrace).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->openBrace).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->openBrace).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->openBrace).info = openBrace.info;
  uVar3 = *(undefined4 *)&(items->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar1 = (items->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->items).super_SyntaxListBase.super_SyntaxNode.kind =
       (items->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (this->items).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (items->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2548;
  (this->items).super_SyntaxListBase.childCount = (items->super_SyntaxListBase).childCount;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005d5a00;
  sVar2 = (items->elements)._M_extent._M_extent_value;
  (this->items).elements._M_ptr = (items->elements)._M_ptr;
  (this->items).elements._M_extent._M_extent_value = sVar2;
  (this->closeBrace).kind = (short)uVar6;
  (this->closeBrace).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->closeBrace).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->closeBrace).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->closeBrace).info = closeBrace.info;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar7 = (this->items).elements._M_extent._M_extent_value + 1;
  if (1 < uVar7) {
    uVar7 = uVar7 >> 1;
    lVar8 = 0;
    do {
      ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((this->items).elements._M_ptr)->super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar8));
      (*ppSVar4)->parent = (SyntaxNode *)this;
      lVar8 = lVar8 + 0x30;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  return;
}

Assistant:

struct SLANG_EXPORT ArgumentSyntax : public SyntaxNode {

    ArgumentSyntax(SyntaxKind kind) :
        SyntaxNode(kind) {
    }

    explicit ArgumentSyntax(const ArgumentSyntax&) = default;

    static bool isKind(SyntaxKind kind);
}